

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

char * get_current_charset(archive_conflict *a)

{
  char *pcVar1;
  char *pcVar2;
  
  if (a != (archive_conflict *)0x0) {
    pcVar1 = a->current_code;
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      pcVar1 = nl_langinfo(0xe);
      if (a->current_code == (char *)0x0) {
        pcVar2 = strdup(pcVar1);
        a->current_code = pcVar2;
        a->current_codepage = 0xffffffff;
        a->current_oemcp = 0xffffffff;
      }
    }
    return pcVar1;
  }
  pcVar1 = nl_langinfo(0xe);
  return pcVar1;
}

Assistant:

static const char *
get_current_charset(struct archive *a)
{
	const char *cur_charset;

	if (a == NULL)
		cur_charset = default_iconv_charset("");
	else {
		cur_charset = default_iconv_charset(a->current_code);
		if (a->current_code == NULL) {
			a->current_code = strdup(cur_charset);
			a->current_codepage = get_current_codepage();
			a->current_oemcp = get_current_oemcp();
		}
	}
	return (cur_charset);
}